

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMatrix.cpp
# Opt level: O0

void __thiscall HMatrix::price_by_col(HMatrix *this,HVector *row_ap,HVector *row_ep)

{
  double dVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  long in_RDX;
  long in_RSI;
  int *in_RDI;
  int k;
  double value;
  int iCol;
  double *ep_array;
  double *ap_array;
  int *ap_index;
  int ap_count;
  int local_4c;
  double local_48;
  int local_3c;
  int local_1c;
  
  local_1c = 0;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RSI + 8),0);
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x20),0);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDX + 0x20),0);
  for (local_3c = 0; local_3c < *in_RDI; local_3c = local_3c + 1) {
    local_48 = 0.0;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_3c);
    local_4c = *pvVar5;
    while( true ) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)(local_3c + 1));
      if (*pvVar5 <= local_4c) break;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_4c);
      dVar1 = pvVar4[*pvVar5];
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),(long)local_4c);
      local_48 = dVar1 * *pvVar6 + local_48;
      local_4c = local_4c + 1;
    }
    if (1e-14 < ABS(local_48)) {
      pvVar3[local_3c] = local_48;
      pvVar2[local_1c] = local_3c;
      local_1c = local_1c + 1;
    }
  }
  *(int *)(in_RSI + 4) = local_1c;
  return;
}

Assistant:

void HMatrix::price_by_col(HVector& row_ap, HVector& row_ep) const {
    // Alias
    int ap_count = 0;
    int *ap_index = &row_ap.index[0];
    double *ap_array = &row_ap.array[0];
    const double *ep_array = &row_ep.array[0];

    // Computation
    for (int iCol = 0; iCol < numCol; iCol++) {
        double value = 0;
        for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++) {
            value += ep_array[Aindex[k]] * Avalue[k];
        }
        if (fabs(value) > HSOL_CONST_TINY) {
            ap_array[iCol] = value;
            ap_index[ap_count++] = iCol;
        }
    }
    row_ap.count = ap_count;

}